

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

U64 HUF_DEltX1_set4(BYTE symbol,BYTE nbBits)

{
  uint uVar1;
  int iVar2;
  undefined8 local_18;
  U64 D4;
  BYTE nbBits_local;
  BYTE symbol_local;
  
  uVar1 = MEM_isLittleEndian();
  if (uVar1 == 0) {
    iVar2 = (uint)symbol * 0x100 + (uint)nbBits;
  }
  else {
    iVar2 = (uint)symbol + (uint)nbBits * 0x100;
  }
  local_18 = (long)iVar2;
  return local_18 * 0x1000100010001;
}

Assistant:

static U64 HUF_DEltX1_set4(BYTE symbol, BYTE nbBits) {
    U64 D4;
    if (MEM_isLittleEndian()) {
        D4 = symbol + (nbBits << 8);
    } else {
        D4 = (symbol << 8) + nbBits;
    }
    D4 *= 0x0001000100010001ULL;
    return D4;
}